

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3_randomness(int N,void *pBuf)

{
  uchar uVar1;
  long lVar2;
  int iVar3;
  sqlite3_mutex *p;
  sqlite3_vfs *pVfs_00;
  long in_FS_OFFSET;
  int local_14c;
  int i;
  sqlite3_vfs *pVfs;
  sqlite3_mutex *mutex;
  uchar *zBuf;
  uchar t;
  void *pBuf_local;
  char local_118 [4];
  int N_local;
  char k [256];
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  iVar3 = sqlite3_initialize();
  if (iVar3 == 0) {
    p = sqlite3MutexAlloc(5);
    sqlite3_mutex_enter(p);
    if ((N < 1) || (pBuf == (void *)0x0)) {
      sqlite3Prng.isInit = '\0';
      sqlite3_mutex_leave(p);
    }
    else {
      mutex = (sqlite3_mutex *)pBuf;
      pBuf_local._4_4_ = N;
      if (sqlite3Prng.isInit == '\0') {
        pVfs_00 = sqlite3_vfs_find((char *)0x0);
        sqlite3Prng.j = '\0';
        sqlite3Prng.i = '\0';
        if (pVfs_00 == (sqlite3_vfs *)0x0) {
          memset(local_118,0,0x100);
        }
        else {
          sqlite3OsRandomness(pVfs_00,0x100,local_118);
        }
        for (local_14c = 0; local_14c < 0x100; local_14c = local_14c + 1) {
          sqlite3Prng.s[local_14c] = (uchar)local_14c;
        }
        for (local_14c = 0; local_14c < 0x100; local_14c = local_14c + 1) {
          sqlite3Prng.j = sqlite3Prng.j + sqlite3Prng.s[local_14c] + local_118[local_14c];
          uVar1 = sqlite3Prng.s[sqlite3Prng.j];
          sqlite3Prng.s[sqlite3Prng.j] = sqlite3Prng.s[local_14c];
          sqlite3Prng.s[local_14c] = uVar1;
        }
        sqlite3Prng.isInit = '\x01';
      }
      do {
        sqlite3Prng.i = sqlite3Prng.i + 1;
        uVar1 = sqlite3Prng.s[sqlite3Prng.i];
        sqlite3Prng.j = sqlite3Prng.j + uVar1;
        sqlite3Prng.s[sqlite3Prng.i] = sqlite3Prng.s[sqlite3Prng.j];
        sqlite3Prng.s[sqlite3Prng.j] = uVar1;
        (mutex->mutex).__size[0] = sqlite3Prng.s[(byte)(uVar1 + sqlite3Prng.s[sqlite3Prng.i])];
        pBuf_local._4_4_ = pBuf_local._4_4_ + -1;
        mutex = (sqlite3_mutex *)((long)&mutex->mutex + 1);
      } while (pBuf_local._4_4_ != 0);
      sqlite3_mutex_leave(p);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

SQLITE_API void sqlite3_randomness(int N, void *pBuf){
  unsigned char t;
  unsigned char *zBuf = pBuf;

  /* The "wsdPrng" macro will resolve to the pseudo-random number generator
  ** state vector.  If writable static data is unsupported on the target,
  ** we have to locate the state vector at run-time.  In the more common
  ** case where writable static data is supported, wsdPrng can refer directly
  ** to the "sqlite3Prng" state vector declared above.
  */
#ifdef SQLITE_OMIT_WSD
  struct sqlite3PrngType *p = &GLOBAL(struct sqlite3PrngType, sqlite3Prng);
# define wsdPrng p[0]
#else
# define wsdPrng sqlite3Prng
#endif

#if SQLITE_THREADSAFE
  sqlite3_mutex *mutex;
#endif

#ifndef SQLITE_OMIT_AUTOINIT
  if( sqlite3_initialize() ) return;
#endif

#if SQLITE_THREADSAFE
  mutex = sqlite3MutexAlloc(SQLITE_MUTEX_STATIC_PRNG);
#endif

  sqlite3_mutex_enter(mutex);
  if( N<=0 || pBuf==0 ){
    wsdPrng.isInit = 0;
    sqlite3_mutex_leave(mutex);
    return;
  }

  /* Initialize the state of the random number generator once,
  ** the first time this routine is called.  The seed value does
  ** not need to contain a lot of randomness since we are not
  ** trying to do secure encryption or anything like that...
  **
  ** Nothing in this file or anywhere else in SQLite does any kind of
  ** encryption.  The RC4 algorithm is being used as a PRNG (pseudo-random
  ** number generator) not as an encryption device.
  */
  if( !wsdPrng.isInit ){
    sqlite3_vfs *pVfs = sqlite3_vfs_find(0);
    int i;
    char k[256];
    wsdPrng.j = 0;
    wsdPrng.i = 0;
    if( NEVER(pVfs==0) ){
      memset(k, 0, sizeof(k));
    }else{
      sqlite3OsRandomness(pVfs, 256, k);
    }
    for(i=0; i<256; i++){
      wsdPrng.s[i] = (u8)i;
    }
    for(i=0; i<256; i++){
      wsdPrng.j += wsdPrng.s[i] + k[i];
      t = wsdPrng.s[wsdPrng.j];
      wsdPrng.s[wsdPrng.j] = wsdPrng.s[i];
      wsdPrng.s[i] = t;
    }
    wsdPrng.isInit = 1;
  }

  assert( N>0 );
  do{
    wsdPrng.i++;
    t = wsdPrng.s[wsdPrng.i];
    wsdPrng.j += t;
    wsdPrng.s[wsdPrng.i] = wsdPrng.s[wsdPrng.j];
    wsdPrng.s[wsdPrng.j] = t;
    t += wsdPrng.s[wsdPrng.i];
    *(zBuf++) = wsdPrng.s[t];
  }while( --N );
  sqlite3_mutex_leave(mutex);
}